

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall re2::RE2::CheckRewriteString(RE2 *this,StringPiece *rewrite,string *error)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  string sStack_38;
  
  pcVar2 = rewrite->data_;
  pcVar3 = pcVar2 + rewrite->size_;
  uVar4 = 0xffffffff;
  do {
    if (pcVar3 <= pcVar2) {
      bVar1 = this->num_captures_ < (int)uVar4;
      if (bVar1) {
        StringPrintf_abi_cxx11_
                  (&sStack_38,
                   "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                  );
        std::__cxx11::string::operator=((string *)error,(string *)&sStack_38);
        std::__cxx11::string::~string((string *)&sStack_38);
      }
      return !bVar1;
    }
    if (*pcVar2 == '\\') {
      pcVar2 = pcVar2 + 1;
      if (pcVar2 == pcVar3) {
LAB_001298b3:
        std::__cxx11::string::assign((char *)error);
        return false;
      }
      if (*pcVar2 != 0x5c) {
        uVar5 = (int)*pcVar2 - 0x30;
        if (9 < uVar5) goto LAB_001298b3;
        if ((int)uVar4 <= (int)uVar5) {
          uVar4 = uVar5;
        }
      }
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

bool RE2::CheckRewriteString(const StringPiece& rewrite,
                             std::string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    *error = StringPrintf(
        "Rewrite schema requests %d matches, but the regexp only has %d "
        "parenthesized subexpressions.",
        max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}